

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadAiger.c
# Opt level: O2

uint Io_ReadAigerDecode(char **ppPos)

{
  byte bVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  
  bVar3 = 0;
  uVar4 = 0;
  pbVar2 = (byte *)*ppPos;
  while( true ) {
    *ppPos = (char *)(pbVar2 + 1);
    bVar1 = *pbVar2;
    if (-1 < (char)bVar1) break;
    uVar4 = uVar4 | (bVar1 & 0x7f) << (bVar3 & 0x1f);
    bVar3 = bVar3 + 7;
    pbVar2 = pbVar2 + 1;
  }
  return (uint)bVar1 << (bVar3 & 0x1f) | uVar4;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Extracts one unsigned AIG edge from the input buffer.]

  Description [This procedure is a slightly modified version of Armin Biere's
  procedure "unsigned decode (FILE * file)". ]
  
  SideEffects [Updates the current reading position.]

  SeeAlso     []

***********************************************************************/
static inline unsigned Io_ReadAigerDecode( char ** ppPos )
{
    unsigned x = 0, i = 0;
    unsigned char ch;

//    while ((ch = getnoneofch (file)) & 0x80)
    while ((ch = *(*ppPos)++) & 0x80)
        x |= (ch & 0x7f) << (7 * i++);

    return x | (ch << (7 * i));
}